

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::load(parser *this,string *file_name)

{
  json_io_exception *this_00;
  int *piVar1;
  ifstream is;
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(&is,(string *)file_name,_S_in);
  if ((abStack_1f8[*(long *)(_is + -0x18)] & 5) == 0) {
    parse(this,(istream *)&is);
    std::ifstream::~ifstream(&is);
    return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
           (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
  }
  this_00 = (json_io_exception *)__cxa_allocate_exception(0xd8);
  piVar1 = __errno_location();
  json_io_exception::json_io_exception(this_00,file_open_failed_e,*piVar1);
  __cxa_throw(this_00,&json_io_exception::typeinfo,std::exception::~exception);
}

Assistant:

unique_ptr<json> parser::load(const string &file_name)
{
    ifstream is(file_name);

    if (is)
    {
        return parse(is);
    }
    else
    {
        throw json_io_exception(json_io_exception::file_open_failed_e, errno);
    }
}